

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void handle_blocking(int socket_descriptor)

{
  int iVar1;
  int in_EDI;
  int return_code;
  int yes;
  undefined4 local_8 [2];
  
  local_8[0] = 1;
  iVar1 = setsockopt(in_EDI,1,2,local_8,4);
  if (iVar1 == -1) {
    throw((char *)0x102405);
  }
  return;
}

Assistant:

void handle_blocking(int socket_descriptor) {
	// Will be necessary when calling setsockopt to free busy sockets
	int yes = 1;

	// Reclaim blocked but unused sockets (from zombie processes)
	// clang-format off
	int return_code = setsockopt(
		socket_descriptor,
		SOL_SOCKET,
		SO_REUSEADDR,
		&yes,
		sizeof yes
	 );
	// clang-format on

	if (return_code == -1) {
		throw("Error reclaiming socket");
	}
}